

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.h
# Opt level: O2

ostream * Eigen::internal::print_matrix<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                    (ostream *s,Matrix<double,__1,__1,_0,__1,__1> *_m,IOFormat *fmt)

{
  ostream oVar1;
  int iVar2;
  IOFormat *pIVar3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  Index j;
  long lVar7;
  long lVar8;
  long local_238;
  stringstream sstr;
  string local_b0 [8];
  long local_a8;
  Matrix<double,__1,__1,_0,__1,__1> *local_90;
  string *local_88;
  string *local_80;
  string *local_78;
  string *local_70;
  undefined8 local_68;
  long local_60;
  undefined8 local_58;
  string *local_50;
  undefined4 local_44;
  IOFormat *local_40;
  ostream local_32;
  ostream local_31;
  
  lVar8 = (_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  lVar7 = (_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  local_40 = fmt;
  if (lVar7 * lVar8 == 0) {
    poVar4 = std::operator<<(s,(string *)fmt);
    std::operator<<(poVar4,(string *)&fmt->matSuffix);
    return s;
  }
  iVar2 = fmt->precision;
  lVar5 = (long)iVar2;
  if (lVar5 == -2) {
    lVar5 = 0xf;
  }
  else {
    local_44 = (undefined4)CONCAT71((int7)((ulong)_m >> 8),1);
    if ((iVar2 == -1) || (iVar2 == 0)) {
      local_58 = 0;
      goto LAB_0011fedc;
    }
  }
  local_58 = *(undefined8 *)(s + *(long *)(*(long *)s + -0x18) + 8);
  *(long *)(s + *(long *)(*(long *)s + -0x18) + 8) = lVar5;
  local_44 = 0;
LAB_0011fedc:
  if ((fmt->flags & 1) == 0) {
    local_50 = (string *)0x0;
    lVar5 = 0;
    lVar6 = 0;
    while (lVar6 < lVar7) {
      local_60 = lVar6;
      for (lVar7 = 0; lVar7 < lVar8; lVar7 = lVar7 + 1) {
        std::__cxx11::stringstream::stringstream((stringstream *)&local_238);
        std::ios::copyfmt((ios *)((stringstream *)&local_238 + *(long *)(local_238 + -0x18)));
        std::ostream::_M_insert<double>
                  (*(double *)
                    ((long)(_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                           m_storage.m_data +
                    lVar7 * 8 +
                    (_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                    .m_rows * (long)local_50));
        std::__cxx11::stringbuf::str();
        if (lVar5 <= local_a8) {
          lVar5 = local_a8;
        }
        std::__cxx11::string::~string(local_b0);
        std::__cxx11::stringstream::~stringstream((stringstream *)&local_238);
        lVar8 = (_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                m_rows;
      }
      lVar7 = (_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_cols;
      local_50 = (string *)((long)local_50 + 8);
      lVar6 = local_60 + 1;
    }
  }
  else {
    lVar5 = 0;
  }
  local_68 = *(undefined8 *)(s + *(long *)(*(long *)s + -0x18) + 0x10);
  local_31 = (ostream)std::ios::fill();
  pIVar3 = local_40;
  std::operator<<(s,(string *)local_40);
  local_78 = (string *)&pIVar3->rowSpacer;
  local_88 = (string *)&pIVar3->rowPrefix;
  local_50 = (string *)&pIVar3->coeffSeparator;
  local_80 = (string *)&pIVar3->rowSuffix;
  local_70 = (string *)&pIVar3->rowSeparator;
  local_90 = _m;
  for (lVar7 = 0;
      lVar7 < (_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_rows; lVar7 = lVar7 + 1) {
    if (lVar7 != 0) {
      std::operator<<(s,local_78);
    }
    std::operator<<(s,local_88);
    if (lVar5 != 0) {
      lVar8 = *(long *)(*(long *)s + -0x18);
      local_32 = (ostream)local_40->fill;
      std::ios::fill();
      s[lVar8 + 0xe0] = local_32;
      *(long *)(s + *(long *)(*(long *)s + -0x18) + 0x10) = lVar5;
    }
    std::ostream::_M_insert<double>
              ((_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_data[lVar7]);
    local_60 = lVar7;
    for (lVar8 = 1;
        lVar8 < (_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                m_cols; lVar8 = lVar8 + 1) {
      std::operator<<(s,local_50);
      if (lVar5 != 0) {
        lVar7 = *(long *)(*(long *)s + -0x18);
        oVar1 = (ostream)local_40->fill;
        std::ios::fill();
        s[lVar7 + 0xe0] = oVar1;
        *(long *)(s + *(long *)(*(long *)s + -0x18) + 0x10) = lVar5;
        lVar7 = local_60;
        _m = local_90;
      }
      std::ostream::_M_insert<double>
                ((_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                 m_data[(_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                        m_storage.m_rows * lVar8 + lVar7]);
    }
    std::operator<<(s,local_80);
    if (lVar7 < (_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                m_rows + -1) {
      std::operator<<(s,local_70);
    }
  }
  std::operator<<(s,(string *)&local_40->matSuffix);
  if ((char)local_44 == '\0') {
    *(undefined8 *)(s + *(long *)(*(long *)s + -0x18) + 8) = local_58;
  }
  if (lVar5 != 0) {
    lVar7 = *(long *)(*(long *)s + -0x18);
    std::ios::fill();
    s[lVar7 + 0xe0] = local_31;
    *(undefined8 *)(s + *(long *)(*(long *)s + -0x18) + 0x10) = local_68;
  }
  return s;
}

Assistant:

std::ostream & print_matrix(std::ostream & s, const Derived& _m, const IOFormat& fmt)
{
  using internal::is_same;
  using internal::conditional;

  if(_m.size() == 0)
  {
    s << fmt.matPrefix << fmt.matSuffix;
    return s;
  }
  
  typename Derived::Nested m = _m;
  typedef typename Derived::Scalar Scalar;
  typedef typename
      conditional<
          is_same<Scalar, char>::value ||
            is_same<Scalar, unsigned char>::value ||
            is_same<Scalar, numext::int8_t>::value ||
            is_same<Scalar, numext::uint8_t>::value,
          int,
          typename conditional<
              is_same<Scalar, std::complex<char> >::value ||
                is_same<Scalar, std::complex<unsigned char> >::value ||
                is_same<Scalar, std::complex<numext::int8_t> >::value ||
                is_same<Scalar, std::complex<numext::uint8_t> >::value,
              std::complex<int>,
              const Scalar&
            >::type
        >::type PrintType;

  Index width = 0;

  std::streamsize explicit_precision;
  if(fmt.precision == StreamPrecision)
  {
    explicit_precision = 0;
  }
  else if(fmt.precision == FullPrecision)
  {
    if (NumTraits<Scalar>::IsInteger)
    {
      explicit_precision = 0;
    }
    else
    {
      explicit_precision = significant_decimals_impl<Scalar>::run();
    }
  }
  else
  {
    explicit_precision = fmt.precision;
  }

  std::streamsize old_precision = 0;
  if(explicit_precision) old_precision = s.precision(explicit_precision);

  bool align_cols = !(fmt.flags & DontAlignCols);
  if(align_cols)
  {
    // compute the largest width
    for(Index j = 0; j < m.cols(); ++j)
      for(Index i = 0; i < m.rows(); ++i)
      {
        std::stringstream sstr;
        sstr.copyfmt(s);
        sstr << static_cast<PrintType>(m.coeff(i,j));
        width = std::max<Index>(width, Index(sstr.str().length()));
      }
  }
  std::streamsize old_width = s.width();
  char old_fill_character = s.fill();
  s << fmt.matPrefix;
  for(Index i = 0; i < m.rows(); ++i)
  {
    if (i)
      s << fmt.rowSpacer;
    s << fmt.rowPrefix;
    if(width) {
      s.fill(fmt.fill);
      s.width(width);
    }
    s << static_cast<PrintType>(m.coeff(i, 0));
    for(Index j = 1; j < m.cols(); ++j)
    {
      s << fmt.coeffSeparator;
      if(width) {
        s.fill(fmt.fill);
        s.width(width);
      }
      s << static_cast<PrintType>(m.coeff(i, j));
    }
    s << fmt.rowSuffix;
    if( i < m.rows() - 1)
      s << fmt.rowSeparator;
  }
  s << fmt.matSuffix;
  if(explicit_precision) s.precision(old_precision);
  if(width) {
    s.fill(old_fill_character);
    s.width(old_width);
  }
  return s;
}